

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

void __thiscall LSL_STDZ<UF>::Dealloc(LSL_STDZ<UF> *this)

{
  Table2D::Release(&this->ERA);
  if (this->ner != (int *)0x0) {
    operator_delete__(this->ner);
  }
  Table2D::Release(&this->RLC);
  Table2D::Release(&this->ER);
  UF::Dealloc();
  return;
}

Assistant:

void Dealloc() {
        ERA.Release();

        delete[] ner;
        RLC.Release();
        ER.Release();

        // No free for img_labels_ because it is required at the end of the algorithm 
        LabelsSolver::Dealloc();
    }